

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall brotli::Command::Command(Command *this,size_t insertlen)

{
  size_t insertlen_local;
  Command *this_local;
  
  this->insert_len_ = (uint32_t)insertlen;
  this->copy_len_ = 0;
  this->dist_extra_ = 0;
  this->dist_prefix_ = 0x10;
  GetLengthCode(insertlen,4,this->dist_prefix_ == 0,&this->cmd_prefix_,&this->cmd_extra_);
  return;
}

Assistant:

explicit Command(size_t insertlen)
      : insert_len_(static_cast<uint32_t>(insertlen))
      , copy_len_(0), dist_extra_(0), dist_prefix_(16) {
    GetLengthCode(insertlen, 4, dist_prefix_ == 0, &cmd_prefix_, &cmd_extra_);
  }